

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int yy_pop_parser_stack(yyParser *pParser)

{
  byte yymajor_00;
  yyStackEntry *yytos;
  uchar yymajor;
  yyParser *pParser_local;
  
  if (pParser->yyidx < 0) {
    pParser_local._4_4_ = 0;
  }
  else {
    yymajor_00 = pParser->yystack[pParser->yyidx].major;
    yy_destructor(pParser,yymajor_00,&pParser->yystack[pParser->yyidx].minor);
    pParser->yyidx = pParser->yyidx + -1;
    pParser_local._4_4_ = (uint)yymajor_00;
  }
  return pParser_local._4_4_;
}

Assistant:

static int yy_pop_parser_stack(yyParser *pParser){
  YYCODETYPE yymajor;
  yyStackEntry *yytos = &pParser->yystack[pParser->yyidx];

  /* There is no mechanism by which the parser stack can be popped below
  ** empty in SQLite.  */
  if( NEVER(pParser->yyidx<0) ) return 0;
#ifndef NDEBUG
  if( yyTraceFILE && pParser->yyidx>=0 ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
  }
#endif
  yymajor = yytos->major;
  yy_destructor(pParser, yymajor, &yytos->minor);
  pParser->yyidx--;
  return yymajor;
}